

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void TestPageMap(void)

{
  void ****__s;
  void ***pppvVar1;
  void **ppvVar2;
  bool bVar3;
  PageMap *this;
  
  puts("===================== TestPageMap BEGIN =====================");
  this = (PageMap *)operator_new(0x2000040);
  (this->internal_allocator).inited = false;
  (this->internal_allocator).construct = true;
  (this->leaf_allocator).inited = false;
  (this->leaf_allocator).construct = true;
  __s = this->roots;
  memset(__s,0,0x2000000);
  bVar3 = tcmalloc::PageMap::Set(this,1,(void *)0x2);
  if (!bVar3) {
    __assert_fail("pm->Set(0x1, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x70,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,2,(void *)0x2);
  if (!bVar3) {
    __assert_fail("pm->Set(0x2, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x71,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,2,(void *)0x3);
  if (!bVar3) {
    __assert_fail("pm->Set(0x2, (void*)3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x72,"void TestPageMap()");
  }
  pppvVar1 = *__s;
  if (((pppvVar1 == (void ***)0x0) || (*pppvVar1 == (void **)0x0)) ||
     ((*pppvVar1)[1] != (void *)0x2)) {
    __assert_fail("pm->Get(0x1) == (void*)2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x73,"void TestPageMap()");
  }
  if (((pppvVar1 != (void ***)0x0) && (*pppvVar1 != (void **)0x0)) &&
     ((*pppvVar1)[3] != (void *)0x0)) {
    __assert_fail("pm->Get(0x3) == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x74,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,0xf00fff0,(void *)0x2);
  if (!bVar3) {
    __assert_fail("pm->Set(0x0f00fff0, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x76,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,0xf00fff1,(void *)0x2);
  if (!bVar3) {
    __assert_fail("pm->Set(0x0f00fff1, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x77,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,0xff00fff0,(void *)0x3);
  if (!bVar3) {
    __assert_fail("pm->Set(0xff00fff0, (void*)3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x78,"void TestPageMap()");
  }
  pppvVar1 = *__s;
  if (((pppvVar1 == (void ***)0x0) || (pppvVar1[0xf0] == (void **)0x0)) ||
     (pppvVar1[0xf0][0xfff1] != (void *)0x2)) {
    __assert_fail("pm->Get(0x0f00fff1) == (void*)2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x79,"void TestPageMap()");
  }
  if (((pppvVar1 == (void ***)0x0) || (pppvVar1[0xff0] == (void **)0x0)) ||
     (pppvVar1[0xff0][0xfff0] != (void *)0x3)) {
    __assert_fail("pm->Get(0xff00fff0) == (void*)3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7a,"void TestPageMap()");
  }
  if (((pppvVar1 != (void ***)0x0) && (pppvVar1[0x8f0] != (void **)0x0)) &&
     (pppvVar1[0x8f0][0xfff0] != (void *)0x0)) {
    __assert_fail("pm->Get(0x8f00fff0) == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7b,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,0xfff100000f00fff0,(void *)0x2);
  if (!bVar3) {
    __assert_fail("pm->Set(0xfff100000f00fff0, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7d,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,0xfff200000f00fff1,(void *)0x2);
  if (!bVar3) {
    __assert_fail("pm->Set(0xfff200000f00fff1, (void*)2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7e,"void TestPageMap()");
  }
  bVar3 = tcmalloc::PageMap::Set(this,0xfff30000ff00fff0,(void *)0x3);
  if (!bVar3) {
    __assert_fail("pm->Set(0xfff30000ff00fff0, (void*)3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x7f,"void TestPageMap()");
  }
  if (((this->roots[0x3ffc80] != (void ***)0x0) &&
      (ppvVar2 = this->roots[0x3ffc80][0xf0], ppvVar2 != (void **)0x0)) &&
     (ppvVar2[0xfff1] == (void *)0x2)) {
    if (((this->roots[0x3ffcc0] == (void ***)0x0) ||
        (ppvVar2 = this->roots[0x3ffcc0][0xff0], ppvVar2 == (void **)0x0)) ||
       (ppvVar2[0xfff0] != (void *)0x3)) {
      __assert_fail("pm->Get(0xfff30000ff00fff0) == (void*)3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                    ,0x81,"void TestPageMap()");
    }
    if (((this->roots[0x3fffc0] != (void ***)0x0) &&
        (ppvVar2 = this->roots[0x3fffc0][0x8f0], ppvVar2 != (void **)0x0)) &&
       (ppvVar2[0xfff0] != (void *)0x0)) {
      __assert_fail("pm->Get(0xffff00008f00fff0) == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                    ,0x82,"void TestPageMap()");
    }
    operator_delete(this,0x2000040);
    puts("===================== TestPageMap PASS =====================");
    return;
  }
  __assert_fail("pm->Get(0xfff200000f00fff1) == (void*)2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,0x80,"void TestPageMap()");
}

Assistant:

void TestPageMap() {
    printf("===================== TestPageMap BEGIN =====================\n");
    auto* pm = new tcmalloc::PageMap();
    assert(pm->Set(0x1, (void*)2));
    assert(pm->Set(0x2, (void*)2));
    assert(pm->Set(0x2, (void*)3));
    assert(pm->Get(0x1) == (void*)2);
    assert(pm->Get(0x3) == nullptr);

    assert(pm->Set(0x0f00fff0, (void*)2));
    assert(pm->Set(0x0f00fff1, (void*)2));
    assert(pm->Set(0xff00fff0, (void*)3));
    assert(pm->Get(0x0f00fff1) == (void*)2);
    assert(pm->Get(0xff00fff0) == (void*)3);
    assert(pm->Get(0x8f00fff0) == nullptr);

    assert(pm->Set(0xfff100000f00fff0, (void*)2));
    assert(pm->Set(0xfff200000f00fff1, (void*)2));
    assert(pm->Set(0xfff30000ff00fff0, (void*)3));
    assert(pm->Get(0xfff200000f00fff1) == (void*)2);
    assert(pm->Get(0xfff30000ff00fff0) == (void*)3);
    assert(pm->Get(0xffff00008f00fff0) == nullptr);
    delete pm;
    printf("===================== TestPageMap PASS =====================\n");
}